

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O2

void glslang::BuiltInVariable
               (char *blockName,char *name,TBuiltInVariable builtIn,TSymbolTable *symbolTable)

{
  pointer pTVar1;
  long lVar2;
  int iVar3;
  TSymbol *pTVar4;
  undefined4 extraout_var;
  TTypeList *pTVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this;
  long lVar6;
  long lVar7;
  pool_allocator<char> local_58;
  TString local_50;
  
  local_58.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
             blockName,&local_58);
  pTVar4 = TSymbolTable::find(symbolTable,&local_50,(bool *)0x0,(bool *)0x0,(int *)0x0);
  if (pTVar4 != (TSymbol *)0x0) {
    iVar3 = (*pTVar4->_vptr_TSymbol[0xd])(pTVar4);
    pTVar5 = TType::getWritableStruct((TType *)CONCAT44(extraout_var,iVar3));
    lVar7 = -1;
    lVar2 = 0;
    do {
      lVar6 = lVar2;
      pTVar1 = (pTVar5->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 1;
      if ((int)((ulong)((long)(pTVar5->
                              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ).
                              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) >> 5) <=
          lVar7) {
        return;
      }
      this = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(**(long **)((long)&pTVar1->type + lVar6) + 0x30))();
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (this,name);
      lVar2 = lVar6 + 0x20;
    } while (iVar3 != 0);
    lVar7 = (**(code **)(**(long **)((long)&((pTVar5->
                                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ).
                                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->type +
                                    lVar6) + 0x50))();
    *(ulong *)(lVar7 + 8) =
         *(ulong *)(lVar7 + 8) & 0xffffffffffff007f | (ulong)((builtIn & 0x1ff) << 7);
  }
  return;
}

Assistant:

static void BuiltInVariable(const char* blockName, const char* name, TBuiltInVariable builtIn, TSymbolTable& symbolTable)
{
    TSymbol* symbol = symbolTable.find(blockName);
    if (symbol == nullptr)
        return;

    TTypeList& structure = *symbol->getWritableType().getWritableStruct();
    for (int i = 0; i < (int)structure.size(); ++i) {
        if (structure[i].type->getFieldName().compare(name) == 0) {
            structure[i].type->getQualifier().builtIn = builtIn;
            return;
        }
    }
}